

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall randomx::Instruction::h_ISTORE(Instruction *this,ostream *os)

{
  byte bVar1;
  long *plVar2;
  
  bVar1 = this->src;
  genAddressRegDst(this,os,this->dst & 7);
  std::__ostream_insert<char,std::char_traits<char>>(os,", r",3);
  plVar2 = (long *)std::ostream::operator<<(os,bVar1 & 7);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void  Instruction::h_ISTORE(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		genAddressRegDst(os, dstIndex);
		os << ", r" << srcIndex << std::endl;
	}